

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_ScaleVelocity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double scalar;
  bool bVar1;
  AActor *pAVar2;
  char *pcVar3;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003e8d1b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e8d0b:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e8d1b:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12a4,
                  "int AF_AActor_A_ScaleVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar2 == (AActor *)0x0) goto LAB_003e8c7c;
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e8d1b;
    }
  }
  else {
    if (pAVar2 != (AActor *)0x0) goto LAB_003e8d0b;
LAB_003e8c7c:
    pAVar2 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      scalar = param[1].field_0.f;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003e8cc0;
        pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003e8cc0:
          pAVar2 = COPY_AAPTR(pAVar2,param[2].field_0.i);
          if (pAVar2 != (AActor *)0x0) {
            bVar1 = TVector3<double>::isZero(&pAVar2->Vel);
            TVector3<double>::operator*=(&pAVar2->Vel,scalar);
            if (!bVar1) {
              CheckStopped(pAVar2);
            }
          }
          return 0;
        }
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12a6,
                    "int AF_AActor_A_ScaleVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar3 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x12a5,
                "int AF_AActor_A_ScaleVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ScaleVelocity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(scale);
	PARAM_INT_DEF(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref == NULL)
	{
		return 0;
	}

	bool was_moving = !ref->Vel.isZero();

	ref->Vel *= scale;

	// If the actor was previously moving but now is not, and is a player,
	// update its player variables. (See A_Stop.)
	if (was_moving)
	{
		CheckStopped(ref);
	}
	return 0;
}